

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

PackedData * __thiscall
soul::Value::PackedData::StructIterator::get
          (PackedData *__return_storage_ptr__,StructIterator *this)

{
  Type *t;
  StructIterator *this_local;
  
  t = Structure::getMemberType(this->structure,this->index - 1);
  PackedData(__return_storage_ptr__,t,this->member,this->memberSize);
  return __return_storage_ptr__;
}

Assistant:

PackedData get() const      { return PackedData (structure.getMemberType (index - 1), member, memberSize); }